

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dungeon.c
# Opt level: O2

int find_branch(char *s,proto_dungeon *pd)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  branch **ppbVar5;
  uint uVar6;
  ulong uVar7;
  tmpbranch *__s1;
  
  if (pd == (proto_dungeon *)0x0) {
    ppbVar5 = &branches;
    do {
      ppbVar5 = &((branch *)ppbVar5)->next->next;
      if ((branch *)ppbVar5 == (branch *)0x0) {
        return -1;
      }
      cVar1 = (((branch *)ppbVar5)->end2).dnum;
      iVar3 = strncasecmp(dungeons[cVar1].dname,s,0xffffffffffffffff);
    } while ((iVar3 != 0) &&
            ((iVar3 = strncasecmp(dungeons[cVar1].dname,"The ",4), iVar3 != 0 ||
             (iVar3 = strncasecmp(dungeons[cVar1].dname + 4,s,0xffffffffffffffff), iVar3 != 0))));
    uVar6 = (int)(char)((((branch *)ppbVar5)->end2).dlevel + (char)dungeons[cVar1].ledger_start) |
            (int)(char)((((branch *)ppbVar5)->end1).dlevel +
                       (char)dungeons[(((branch *)ppbVar5)->end1).dnum].ledger_start) << 8;
  }
  else {
    uVar2 = pd->n_brs;
    __s1 = pd->tmpbranch;
    uVar4 = 0;
    uVar7 = 0;
    if (0 < (int)uVar2) {
      uVar7 = (ulong)uVar2;
    }
    for (; uVar7 != uVar4; uVar4 = uVar4 + 1) {
      iVar3 = strcmp(__s1->name,s);
      if (iVar3 == 0) {
        uVar7 = uVar4 & 0xffffffff;
        break;
      }
      __s1 = __s1 + 1;
    }
    uVar6 = (uint)uVar7;
    if (uVar6 == uVar2) {
      panic("find_branch: can\'t find %s",s);
    }
  }
  return uVar6;
}

Assistant:

static int find_branch(const char *s, /* dungeon name */
		       struct proto_dungeon *pd)
{
	int i;

	if (pd) {
	    for (i = 0; i < pd->n_brs; i++)
		if (!strcmp(pd->tmpbranch[i].name, s)) break;
	    if (i == pd->n_brs) panic("find_branch: can't find %s", s);
	} else {
	    /* support for level tport by name */
	    branch *br;
	    const char *dnam;

	    for (br = branches; br; br = br->next) {
		dnam = dungeons[br->end2.dnum].dname;
		if (!strcmpi(dnam, s) ||
			(!strncmpi(dnam, "The ", 4) && !strcmpi(dnam + 4, s)))
		    break;
	    }
	    i = br ? ((ledger_no(&br->end1) << 8) | ledger_no(&br->end2)) : -1;
	}
	return i;
}